

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.hpp
# Opt level: O0

void __thiscall diy::Master::InFlightRecv::reset(InFlightRecv *this)

{
  InFlightRecv *in_RDI;
  MemoryManagement mem_;
  InFlightRecv *pIVar1;
  MemoryManagement *in_stack_fffffffffffffec8;
  MemoryManagement *in_stack_fffffffffffffed0;
  InFlightRecv local_128;
  
  MemoryManagement::MemoryManagement(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_128.mem.copy.super__Function_base._M_manager = (_Manager_type)0x0;
  local_128.mem.copy._M_invoker = (_Invoker_type)0x0;
  local_128.mem.copy.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_128.mem.copy.super__Function_base._M_functor._8_8_ = 0;
  local_128.mem.deallocate.super__Function_base._M_manager = (_Manager_type)0x0;
  local_128.mem.deallocate._M_invoker = (_Invoker_type)0x0;
  local_128.mem.deallocate.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_128.mem.deallocate.super__Function_base._M_functor._8_8_ = 0;
  local_128.mem.allocate.super__Function_base._M_manager = (_Manager_type)0x0;
  local_128.mem.allocate._M_invoker = (_Invoker_type)0x0;
  local_128.mem.allocate.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_128.mem.allocate.super__Function_base._M_functor._8_8_ = 0;
  local_128.info.nparts = 0;
  local_128.info.round = 0;
  local_128.info.nblobs = 0;
  local_128.done = false;
  local_128._93_3_ = 0;
  local_128.message.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.info.from = 0;
  local_128.info.to = 0;
  local_128.message.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.message.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.message.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  local_128.message.blob_position = 0;
  local_128.message.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_128.message.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_7_ = 0;
  local_128.message.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_ = 0;
  local_128.message.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)0x0;
  local_128.message.position = 0;
  InFlightRecv(in_RDI);
  pIVar1 = &local_128;
  operator=(in_RDI,pIVar1);
  ~InFlightRecv(in_RDI);
  MemoryManagement::operator=((MemoryManagement *)in_RDI,(MemoryManagement *)pIVar1);
  MemoryManagement::~MemoryManagement((MemoryManagement *)in_RDI);
  return;
}

Assistant:

void            reset()
        {
            MemoryManagement mem_ = mem;
            *this = InFlightRecv();
            mem = mem_;
        }